

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plibraryloader_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pint pVar1;
  pint pVar2;
  char *__s;
  bool bVar3;
  
  if (1 < argc) {
    g_argv = argv[(ulong)(uint)argc - 1];
    printf("Running test case: %s\n","plibraryloader_nomem_test");
    pVar1 = p_test_case_plibraryloader_nomem_test();
    printf("Running test case: %s\n","plibraryloader_general_test");
    pVar2 = p_test_case_plibraryloader_general_test();
    g_argv = (pchar *)0x0;
    bVar3 = pVar2 + pVar1 != 0;
    __s = "Test passed";
    if (bVar3) {
      __s = "Test failed";
    }
    puts(__s);
    return -(uint)bVar3;
  }
  printf("%s:%d: required check failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/plibraryloader_test.cpp"
         ,0xbd);
  exit(-1);
}

Assistant:

P_TEST_SUITE_ARGS_BEGIN()
{
        /* We assume that 3rd argument is ourself library path */
        P_TEST_REQUIRE (argc > 1);

        g_argv = argv[argc - 1];

	P_TEST_SUITE_RUN_CASE (plibraryloader_nomem_test);
        P_TEST_SUITE_RUN_CASE (plibraryloader_general_test);

        g_argv = NULL;
}